

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O3

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(cmGeneratorTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this;
  bool bVar2;
  char *pcVar3;
  string automocTargetName;
  string mocCppFile;
  string local_88;
  string local_68;
  string local_48;
  
  this = target->Target->Makefile;
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"AUTOMOC","");
  bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    GetAutogenTargetName_abi_cxx11_(&local_88,target);
    pcVar3 = cmMakefile::GetCurrentBinaryDirectory(this);
    std::__cxx11::string::string((string *)&local_68,pcVar3,(allocator *)&local_48);
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_68);
    cmMakefile::GetOrCreateSource(this,&local_68,true);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"ADDITIONAL_MAKE_CLEAN_FILES","");
    cmMakefile::AppendProperty(this,&local_48,local_68._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorTarget::AddSource(target,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(
    cmGeneratorTarget* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    std::string automocTargetName = GetAutogenTargetName(target);
    std::string mocCppFile = makefile->GetCurrentBinaryDirectory();
    mocCppFile += "/";
    mocCppFile += automocTargetName;
    mocCppFile += ".cpp";
    makefile->GetOrCreateSource(mocCppFile, true);
    makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES",
                            mocCppFile.c_str(), false);

    target->AddSource(mocCppFile);
    }
}